

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O2

back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_>
fmt::v8::detail::
write_int_noinline<wchar_t,std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,unsigned_int>
          (back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_> out,
          write_int_arg<unsigned_int> arg,basic_format_specs<wchar_t> *specs,locale_ref loc)

{
  presentation_type pVar1;
  bool bVar2;
  byte bVar3;
  uint uVar4;
  back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_> bVar5;
  wchar_t prefix;
  int iVar6;
  uint uVar7;
  wchar_t value;
  ulong value_00;
  anon_class_8_2_0dfc6556_for_write_digits aVar8;
  ulong uVar9;
  anon_class_12_3_01816715_for_write_digits local_80;
  undefined1 local_70 [32];
  bool local_50;
  back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_> local_48;
  write_int_data<wchar_t> data;
  
  pVar1 = specs->type;
  local_48.container = out.container;
  if (pVar1 < string) {
    uVar9 = (ulong)arg >> 0x20;
    prefix = arg.prefix;
    value = arg.abs_value;
    switch(pVar1) {
    case none:
    case dec:
      value_00 = (ulong)arg & 0xffffffff;
      if (((specs->field_0xa & 1) == 0) ||
         (bVar2 = write_int_localized<std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,unsigned_long,wchar_t>
                            (&local_48,value_00,prefix,specs,loc), !bVar2)) {
        bVar5.container = local_48.container;
        uVar7 = 0x1f;
        if ((value | 1U) != 0) {
          for (; (uint)(value | 1U) >> uVar7 == 0; uVar7 = uVar7 - 1) {
          }
        }
        aVar8 = (anon_class_8_2_0dfc6556_for_write_digits)
                (*(long *)(do_count_digits(unsigned_int)::table + (ulong)uVar7 * 8) + value_00 &
                 0xffffffff00000000 | value_00);
        iVar6 = (int)(*(long *)(do_count_digits(unsigned_int)::table + (ulong)uVar7 * 8) + value_00
                     >> 0x20);
        local_80._0_8_ = aVar8;
        if (specs->precision == -1 && specs->width == 0) {
          to_unsigned<int>(iVar6);
          if (uVar9 != 0) {
            for (uVar7 = prefix & 0xffffff; uVar7 != 0; uVar7 = uVar7 >> 8) {
              local_70._0_4_ = uVar7 & 0xff;
              buffer<wchar_t>::push_back(bVar5.container,(wchar_t *)local_70);
            }
          }
          local_48 = write_int<std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_>,_wchar_t,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/external/fmt/include/fmt/format.h:1589:41)>
                     ::anon_class_32_3_03e05ccd::anon_class_8_2_0dfc6556_for_write_digits::
                     operator()((anon_class_8_2_0dfc6556_for_write_digits *)&local_80,
                                bVar5.container);
        }
        else {
          write_int_data<wchar_t>::write_int_data(&data,iVar6,prefix,specs);
          local_70._8_8_ = data.size;
          local_70._16_8_ = data.padding;
          local_70._0_4_ = prefix;
          local_70._24_8_ = aVar8;
          local_48 = write_padded<(fmt::v8::align::type)2,std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,wchar_t,fmt::v8::detail::write_int<std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,wchar_t,fmt::v8::detail::write_int<wchar_t,std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,unsigned_int>(std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,fmt::v8::detail::write_int_arg<unsigned_int>,fmt::v8::basic_format_specs<wchar_t>const&,fmt::v8::detail::locale_ref)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>)_1_>(std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,int,unsigned_int,fmt::v8::basic_format_specs<wchar_t>const&,fmt::v8::detail::write_int<wchar_t,std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,unsigned_int>(std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,fmt::v8::detail::write_int_arg<unsigned_int>,fmt::v8::basic_format_specs<wchar_t>const&,fmt::v8::detail::locale_ref)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>)_1_)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>)_1_>
                               (bVar5,specs,data.size,(anon_class_32_3_03e05ccd *)local_70);
        }
      }
      break;
    case oct:
      iVar6 = 0x1f;
      if ((value | 1U) != 0) {
        for (; (uint)(value | 1U) >> iVar6 == 0; iVar6 = iVar6 + -1) {
        }
      }
      bVar3 = (char)(((ushort)iVar6 & 0xff) / 3) + 1;
      if (((specs->field_0x9 & 0x80) != 0) &&
         (value != L'\0' && specs->precision <= (int)(uint)bVar3)) {
        uVar7 = 0x3000;
        if (uVar9 == 0) {
          uVar7 = 0x30;
        }
        prefix = (uVar7 | prefix) + L'\x01000000';
      }
      aVar8 = (anon_class_8_2_0dfc6556_for_write_digits)
              ((ulong)arg & 0xffffffff | (ulong)bVar3 << 0x20);
      local_80._0_8_ = aVar8;
      if (specs->precision == -1 && specs->width == 0) {
        to_unsigned<int>((uint)bVar3);
        if (prefix != L'\0') {
          for (uVar7 = prefix & 0xffffff; uVar7 != 0; uVar7 = uVar7 >> 8) {
            local_70._0_4_ = uVar7 & 0xff;
            buffer<wchar_t>::push_back(out.container,(wchar_t *)local_70);
          }
        }
        local_48 = write_int<std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_>,_wchar_t,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/external/fmt/include/fmt/format.h:1622:22)>
                   ::anon_class_32_3_03e05ccd::anon_class_8_2_0dfc6556_for_write_digits::operator()
                             ((anon_class_8_2_0dfc6556_for_write_digits *)&local_80,out.container);
      }
      else {
        write_int_data<wchar_t>::write_int_data(&data,(uint)bVar3,prefix,specs);
        local_70._8_8_ = data.size;
        local_70._16_8_ = data.padding;
        local_70._0_4_ = prefix;
        local_70._24_8_ = aVar8;
        local_48 = write_padded<(fmt::v8::align::type)2,std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,wchar_t,fmt::v8::detail::write_int<std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,wchar_t,fmt::v8::detail::write_int<wchar_t,std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,unsigned_int>(std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,fmt::v8::detail::write_int_arg<unsigned_int>,fmt::v8::basic_format_specs<wchar_t>const&,fmt::v8::detail::locale_ref)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>)_4_>(std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,int,unsigned_int,fmt::v8::basic_format_specs<wchar_t>const&,fmt::v8::detail::write_int<wchar_t,std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,unsigned_int>(std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,fmt::v8::detail::write_int_arg<unsigned_int>,fmt::v8::basic_format_specs<wchar_t>const&,fmt::v8::detail::locale_ref)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>)_4_)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>)_1_>
                             (out,specs,data.size,(anon_class_32_3_03e05ccd *)local_70);
      }
      break;
    case hex_lower:
    case hex_upper:
      local_80.upper = pVar1 == hex_upper;
      if ((specs->field_0x9 & 0x80) != 0) {
        uVar4 = (uint)(pVar1 != hex_upper) << 0xd | 0x5830;
        uVar7 = uVar4 << 8;
        if (uVar9 == 0) {
          uVar7 = uVar4;
        }
        prefix = (uVar7 | prefix) + L'\x02000000';
      }
      uVar7 = 0x1f;
      if ((value | 1U) != 0) {
        for (; (uint)(value | 1U) >> uVar7 == 0; uVar7 = uVar7 - 1) {
        }
      }
      uVar7 = 8 - ((uVar7 ^ 0x1c) >> 2);
      local_80._0_8_ = (ulong)arg & 0xffffffff | (ulong)uVar7 << 0x20;
      if (specs->precision == -1 && specs->width == 0) {
        to_unsigned<int>(uVar7);
        if (prefix != L'\0') {
          for (uVar7 = prefix & 0xffffff; uVar7 != 0; uVar7 = uVar7 >> 8) {
            local_70._0_4_ = uVar7 & 0xff;
            buffer<wchar_t>::push_back(out.container,(wchar_t *)local_70);
          }
        }
        local_48 = write_int<std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_>,_wchar_t,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/external/fmt/include/fmt/format.h:1600:41)>
                   ::anon_class_40_3_03e05ccd::anon_class_12_3_01816715_for_write_digits::operator()
                             (&local_80,out.container);
      }
      else {
        write_int_data<wchar_t>::write_int_data(&data,uVar7,prefix,specs);
        local_70._8_8_ = data.size;
        local_70._16_8_ = data.padding;
        local_70._24_4_ = local_80.abs_value;
        local_70._28_4_ = local_80.num_digits;
        local_50 = local_80.upper;
        local_70._0_4_ = prefix;
        local_48 = write_padded<(fmt::v8::align::type)2,std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,wchar_t,fmt::v8::detail::write_int<std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,wchar_t,fmt::v8::detail::write_int<wchar_t,std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,unsigned_int>(std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,fmt::v8::detail::write_int_arg<unsigned_int>,fmt::v8::basic_format_specs<wchar_t>const&,fmt::v8::detail::locale_ref)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>)_2_>(std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,int,unsigned_int,fmt::v8::basic_format_specs<wchar_t>const&,fmt::v8::detail::write_int<wchar_t,std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,unsigned_int>(std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,fmt::v8::detail::write_int_arg<unsigned_int>,fmt::v8::basic_format_specs<wchar_t>const&,fmt::v8::detail::locale_ref)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>)_2_)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>)_1_>
                             (out,specs,data.size,(anon_class_40_3_03e05ccd *)local_70);
      }
      break;
    case bin_lower:
    case bin_upper:
      if ((specs->field_0x9 & 0x80) != 0) {
        uVar4 = (uint)(pVar1 != bin_upper) << 0xd | 0x4230;
        uVar7 = uVar4 << 8;
        if (uVar9 == 0) {
          uVar7 = uVar4;
        }
        prefix = (uVar7 | prefix) + L'\x02000000';
      }
      uVar7 = 0x1f;
      if ((value | 1U) != 0) {
        for (; (uint)(value | 1U) >> uVar7 == 0; uVar7 = uVar7 - 1) {
        }
      }
      uVar7 = (uVar7 ^ 0xffffffe0) + 0x21;
      aVar8 = (anon_class_8_2_0dfc6556_for_write_digits)
              ((ulong)arg & 0xffffffff | (ulong)uVar7 << 0x20);
      local_80._0_8_ = aVar8;
      if (specs->precision == -1 && specs->width == 0) {
        to_unsigned<int>(uVar7);
        if (prefix != L'\0') {
          for (uVar7 = prefix & 0xffffff; uVar7 != 0; uVar7 = uVar7 >> 8) {
            local_70._0_4_ = uVar7 & 0xff;
            buffer<wchar_t>::push_back(out.container,(wchar_t *)local_70);
          }
        }
        local_48 = write_int<std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_>,_wchar_t,_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_1510/JAJames[P]Jupiter-Bot/src/Jupiter/src/jessilib/src/external/fmt/include/fmt/format.h:1611:22)>
                   ::anon_class_32_3_03e05ccd::anon_class_8_2_0dfc6556_for_write_digits::operator()
                             ((anon_class_8_2_0dfc6556_for_write_digits *)&local_80,out.container);
      }
      else {
        write_int_data<wchar_t>::write_int_data(&data,uVar7,prefix,specs);
        local_70._8_8_ = data.size;
        local_70._16_8_ = data.padding;
        local_70._0_4_ = prefix;
        local_70._24_8_ = aVar8;
        local_48 = write_padded<(fmt::v8::align::type)2,std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,wchar_t,fmt::v8::detail::write_int<std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,wchar_t,fmt::v8::detail::write_int<wchar_t,std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,unsigned_int>(std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,fmt::v8::detail::write_int_arg<unsigned_int>,fmt::v8::basic_format_specs<wchar_t>const&,fmt::v8::detail::locale_ref)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>)_3_>(std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,int,unsigned_int,fmt::v8::basic_format_specs<wchar_t>const&,fmt::v8::detail::write_int<wchar_t,std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,unsigned_int>(std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>,fmt::v8::detail::write_int_arg<unsigned_int>,fmt::v8::basic_format_specs<wchar_t>const&,fmt::v8::detail::locale_ref)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>)_3_)::_lambda(std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>)_1_>
                             (out,specs,data.size,(anon_class_32_3_03e05ccd *)local_70);
      }
      break;
    default:
      goto switchD_001a4586_caseD_7;
    case chr:
      bVar5 = write_char<wchar_t,std::back_insert_iterator<fmt::v8::detail::buffer<wchar_t>>>
                        (out,value,specs);
      return (back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_>)bVar5.container;
    }
    return (back_insert_iterator<fmt::v8::detail::buffer<wchar_t>_>)local_48.container;
  }
switchD_001a4586_caseD_7:
  fmt::v8::detail::throw_format_error("invalid type specifier");
}

Assistant:

FMT_CONSTEXPR FMT_NOINLINE auto write_int_noinline(
    OutputIt out, write_int_arg<T> arg, const basic_format_specs<Char>& specs,
    locale_ref loc) -> OutputIt {
  return write_int(out, arg, specs, loc);
}